

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::StrictEqual(Var aLeft,Var aRight,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  JavascriptString *aLeft_00;
  JavascriptString *aRight_00;
  RecyclableObject *pRVar6;
  ScriptContext *in_R8;
  Type leftType;
  Type rightType;
  uint local_38;
  byte local_31;
  BOOL result;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00aa7518;
    *puVar5 = 0;
LAB_00aa715a:
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00aa7518;
      *puVar5 = 0;
    }
    leftType = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)leftType) && (BVar3 = RecyclableObject::IsExternal(pRVar6), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00aa7518;
LAB_00aa7227:
      *puVar5 = 0;
    }
LAB_00aa723c:
    if ((aLeft == aRight) && (leftType != TypeIds_Number)) {
      return 1;
    }
  }
  else {
    if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00aa7518;
      leftType = TypeIds_FirstNumberType;
      goto LAB_00aa7227;
    }
    leftType = TypeIds_FirstNumberType;
    if (((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) goto LAB_00aa723c;
    if ((ulong)aLeft >> 0x32 == 0) goto LAB_00aa715a;
    leftType = TypeIds_Number;
  }
  local_31 = aLeft == aRight;
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00aa7518;
    *puVar5 = 0;
LAB_00aa7365:
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00aa7518;
      *puVar5 = 0;
    }
    rightType = ((pRVar6->type).ptr)->typeId;
    if (((int)rightType < 0x58) || (BVar3 = RecyclableObject::IsExternal(pRVar6), BVar3 != 0))
    goto LAB_00aa745d;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar2) {
LAB_00aa7518:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
      rightType = TypeIds_FirstNumberType;
      if ((((ulong)aRight & 0xffff000000000000) == 0x1000000000000) ||
         (rightType = TypeIds_Number, (ulong)aRight >> 0x32 != 0)) goto LAB_00aa745d;
      goto LAB_00aa7365;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aa7518;
    rightType = TypeIds_FirstNumberType;
  }
  *puVar5 = 0;
LAB_00aa745d:
  if (leftType == TypeIds_String) {
    if (rightType != TypeIds_String) {
      return 0;
    }
    aLeft_00 = UnsafeVarTo<Js::JavascriptString>(aLeft);
    aRight_00 = UnsafeVarTo<Js::JavascriptString>(aRight);
    bVar2 = JavascriptString::Equals(aLeft_00,aRight_00);
  }
  else {
    if (leftType - TypeIds_FirstNumberType < 4) {
      BVar3 = StrictEqualNumberType(aLeft,aRight,leftType,rightType,in_R8);
      return BVar3;
    }
    if (leftType != TypeIds_BigInt) {
      if (leftType != TypeIds_GlobalObject) {
        return (uint)local_31;
      }
      pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
      iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2f])(pRVar6,aRight,&local_38,requestContext);
      if (iVar4 != 0) {
        return local_38;
      }
      return 0;
    }
    if (rightType != TypeIds_BigInt) {
      return 0;
    }
    bVar2 = JavascriptBigInt::Equals(aLeft,aRight);
  }
  return (uint)bVar2;
}

Assistant:

BOOL JavascriptOperators::StrictEqual(Var aLeft, Var aRight, ScriptContext* requestContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_StrictEqual);
        TypeId rightType, leftType;
        leftType = JavascriptOperators::GetTypeId(aLeft);

        // Because NaN !== NaN, we may not return TRUE when typeId is Number
        if (aLeft == aRight && leftType != TypeIds_Number) return TRUE;

        rightType = JavascriptOperators::GetTypeId(aRight);

        if (leftType == TypeIds_String)
        {
            if (rightType == TypeIds_String)
            {
                return JavascriptString::Equals(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
            }
            return FALSE;
        }
        else if (leftType >= TypeIds_Integer && leftType <= TypeIds_UInt64Number)
        {
            return JavascriptOperators::StrictEqualNumberType(aLeft, aRight, leftType, rightType, requestContext);
        }
        else if (leftType == TypeIds_GlobalObject)
        {
            BOOL result;
            if (UnsafeVarTo<RecyclableObject>(aLeft)->StrictEquals(aRight, &result, requestContext))
            {
                return result;
            }
            return false;
        }
        else if (leftType == TypeIds_BigInt)
        {
            if (rightType == TypeIds_BigInt)
            {
                return JavascriptBigInt::Equals(aLeft, aRight);
            }
            return FALSE;
        }

        return aLeft == aRight;
        JIT_HELPER_END(Op_StrictEqual);
    }